

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

parse_error *
nlohmann::detail::parse_error::create
          (parse_error *__return_storage_ptr__,int id_,size_t byte_,string *what_arg)

{
  bool bVar1;
  char cVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  size_t sVar6;
  long *plVar7;
  char cVar8;
  ulong uVar9;
  string w;
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  long *local_110;
  undefined8 local_108;
  long local_100;
  undefined8 uStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  uint local_68;
  long local_60 [2];
  string local_50;
  
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"parse_error","");
  exception::name(&local_50,&local_d0,id_);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_e0 = *puVar5;
    uStack_d8 = (undefined4)plVar3[3];
    uStack_d4 = *(undefined4 *)((long)plVar3 + 0x1c);
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar5;
    local_f0 = (ulong *)*plVar3;
  }
  local_e8 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (byte_ == 0) {
    local_130 = &local_120;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"");
  }
  else {
    cVar8 = '\x01';
    if (9 < byte_) {
      sVar6 = byte_;
      cVar2 = '\x04';
      do {
        cVar8 = cVar2;
        if (sVar6 < 100) {
          cVar8 = cVar8 + -2;
          goto LAB_0016a029;
        }
        if (sVar6 < 1000) {
          cVar8 = cVar8 + -1;
          goto LAB_0016a029;
        }
        if (sVar6 < 10000) goto LAB_0016a029;
        bVar1 = 99999 < sVar6;
        sVar6 = sVar6 / 10000;
        cVar2 = cVar8 + '\x04';
      } while (bVar1);
      cVar8 = cVar8 + '\x01';
    }
LAB_0016a029:
    local_70 = local_60;
    std::__cxx11::string::_M_construct((ulong)&local_70,cVar8);
    Catch::clara::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_70,local_68,byte_);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x17787e);
    local_130 = &local_120;
    puVar5 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar5) {
      local_120 = *puVar5;
      lStack_118 = plVar3[3];
    }
    else {
      local_120 = *puVar5;
      local_130 = (ulong *)*plVar3;
    }
    local_128 = plVar3[1];
    *plVar3 = (long)puVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
  }
  uVar9 = 0xf;
  if (local_f0 != &local_e0) {
    uVar9 = local_e0;
  }
  if (uVar9 < (ulong)(local_128 + local_e8)) {
    uVar9 = 0xf;
    if (local_130 != &local_120) {
      uVar9 = local_120;
    }
    if ((ulong)(local_128 + local_e8) <= uVar9) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_f0);
      goto LAB_0016a11c;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_130);
LAB_0016a11c:
  local_110 = &local_100;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_100 = *plVar3;
    uStack_f8 = puVar4[3];
  }
  else {
    local_100 = *plVar3;
    local_110 = (long *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_110);
  plVar7 = plVar3 + 2;
  if ((long *)*plVar3 == plVar7) {
    local_80 = *plVar7;
    lStack_78 = plVar3[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar7;
    local_90 = (long *)*plVar3;
  }
  local_88 = plVar3[1];
  *plVar3 = (long)plVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)(what_arg->_M_dataplus)._M_p);
  plVar7 = plVar3 + 2;
  if ((long *)*plVar3 == plVar7) {
    local_a0 = *plVar7;
    lStack_98 = plVar3[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar7;
    local_b0 = (long *)*plVar3;
  }
  local_a8 = plVar3[1];
  *plVar3 = (long)plVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if ((byte_ != 0) && (local_70 != local_60)) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  exception::exception(&__return_storage_ptr__->super_exception,id_,(char *)local_b0);
  *(undefined ***)&__return_storage_ptr__->super_exception = &PTR__exception_001a99d8;
  __return_storage_ptr__->byte = byte_;
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static parse_error create(int id_, std::size_t byte_, const std::string& what_arg)
{
std::string w = exception::name("parse_error", id_) + "parse error" +
(byte_ != 0 ? (" at " + std::to_string(byte_)) : "") +
": " + what_arg;
return parse_error(id_, byte_, w.c_str());
}